

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O3

void change_calls(gen_ctx_t gen_ctx,uint8_t *base)

{
  const_ref_t *pcVar1;
  MIR_item_t pMVar2;
  size_t sVar3;
  ulong uVar4;
  VARR_call_ref_t *pVVar5;
  VARR_uint64_t *pVVar6;
  int iVar7;
  VARR_const_ref_t *pVVar8;
  call_ref_t *__ptr;
  long lVar9;
  long lVar10;
  target_ctx *ptVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t *addr;
  uint8_t *puVar14;
  size_t sVar15;
  uint8_t rel_insn [6];
  uint8_t local_60 [8];
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  gen_ctx_t local_40;
  MIR_context_t local_38;
  
  ptVar11 = gen_ctx->target_ctx;
  pVVar8 = ptVar11->const_refs;
  if (pVVar8 != (VARR_const_ref_t *)0x0) {
    local_38 = gen_ctx->ctx;
    uVar13 = 0;
    local_48 = base;
    local_40 = gen_ctx;
    do {
      if (pVVar8->els_num <= uVar13) {
        return;
      }
      pcVar1 = pVVar8->varr;
      if (pcVar1 == (const_ref_t *)0x0) {
LAB_00173f04:
        change_calls_cold_3();
LAB_00173f09:
        __assert_fail("base[cr.pc - 2] == 0xff",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0xb88,"void change_calls(gen_ctx_t, uint8_t *)");
      }
      if (pcVar1[uVar13].call_p != 0) {
        sVar15 = pcVar1[uVar13].pc;
        if (base[sVar15 - 2] != 0xff) goto LAB_00173f09;
        puVar14 = base + sVar15;
        pMVar2 = pcVar1[uVar13].func_item;
        sVar3 = pcVar1[uVar13].next_insn_disp;
        uVar4 = pcVar1[uVar13].const_num;
        if ((puVar14[-1] != '\x15') && (puVar14[-1] != '%')) {
          __assert_fail("base[cr.pc - 1] == 0x15 || base[cr.pc - 1] == 0x25",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0xb89,"void change_calls(gen_ctx_t, uint8_t *)");
        }
        addr = base + (sVar15 - 2);
        if (pMVar2 != (MIR_item_t)0x0) {
          local_58 = puVar14;
          local_50 = base + (sVar15 - 2);
          iVar7 = MIR_get_func_redef_permission_p(gen_ctx->ctx);
          ptVar11 = gen_ctx->target_ctx;
          addr = local_50;
          puVar14 = local_58;
          if (iVar7 == 0) {
            pVVar5 = ptVar11->call_refs;
            __ptr = pVVar5->varr;
            if (__ptr == (call_ref_t *)0x0) {
              change_calls_cold_1();
              return;
            }
            sVar15 = pVVar5->els_num;
            uVar12 = sVar15 + 1;
            if (pVVar5->size < uVar12) {
              sVar15 = (uVar12 >> 1) + uVar12;
              __ptr = (call_ref_t *)realloc(__ptr,sVar15 * 0x10);
              pVVar5->varr = __ptr;
              pVVar5->size = sVar15;
              sVar15 = pVVar5->els_num;
              uVar12 = sVar15 + 1;
              base = local_48;
            }
            pVVar5->els_num = uVar12;
            __ptr[sVar15].ref_func_item = pMVar2;
            __ptr[sVar15].call_addr = local_50;
            ptVar11 = local_40->target_ctx;
            gen_ctx = local_40;
            addr = local_50;
            puVar14 = local_58;
          }
        }
        pVVar6 = ptVar11->const_pool;
        if (((pVVar6 == (VARR_uint64_t *)0x0) || (pVVar6->varr == (uint64_t *)0x0)) ||
           (pVVar6->els_num <= uVar4)) {
          change_calls_cold_2();
          goto LAB_00173f04;
        }
        lVar9 = pVVar6->varr[uVar4] - (long)(base + sVar3);
        if ((int)lVar9 == lVar9) {
          local_60[4] = '\0';
          local_60[5] = '\0';
          local_60[0] = '@';
          local_60[1] = 0xe8;
          local_60[2] = '\0';
          local_60[3] = '\0';
          if (puVar14[-1] == '%') {
            local_60[0] = '@';
            local_60[1] = 0xe9;
            local_60[2] = '\0';
            local_60[3] = '\0';
          }
          lVar10 = 2;
          do {
            local_60[lVar10] = (uint8_t)lVar9;
            lVar10 = lVar10 + 1;
            lVar9 = lVar9 >> 8;
          } while (lVar10 != 6);
          _MIR_change_code(local_38,addr,local_60,6);
          ptVar11 = gen_ctx->target_ctx;
        }
      }
      pVVar8 = ptVar11->const_refs;
      uVar13 = uVar13 + 1;
    } while (pVVar8 != (VARR_const_ref_t *)0x0);
  }
  change_calls_cold_4();
  return;
}

Assistant:

static void change_calls (gen_ctx_t gen_ctx, uint8_t *base) {
  MIR_context_t ctx = gen_ctx->ctx;
  /* changing calls to rel32 calls: */
  for (size_t i = 0; i < VARR_LENGTH (const_ref_t, const_refs); i++) {
    const_ref_t cr = VARR_GET (const_ref_t, const_refs, i);
    if (!cr.call_p) continue;
    gen_assert (base[cr.pc - 2] == 0xff);
    gen_assert (base[cr.pc - 1] == 0x15 || base[cr.pc - 1] == 0x25);
    if (cr.func_item != NULL) store_call_ref (gen_ctx, cr.func_item, (uint8_t *) base + cr.pc - 2);
    uint64_t v = VARR_GET (uint64_t, const_pool, cr.const_num);
    int64_t off = (int64_t) v - (int64_t) (base + cr.next_insn_disp);
    if (!int32_p (off)) continue;
    uint8_t rel_insn[] = {0x40, 0xe8, 0, 0, 0, 0};   /* rex call rel32 */
    if (base[cr.pc - 1] == 0x25) rel_insn[1] = 0xe9; /* rex jmp rel32 */
    set_int64 (rel_insn + 2, off, 4);
    _MIR_change_code (ctx, (uint8_t *) base + cr.pc - 2, (uint8_t *) rel_insn, 6);
  }
}